

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

void __thiscall
btQuantizedBvh::walkStacklessQuantizedTreeAgainstRay
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *raySource,
          btVector3 *rayTarget,btVector3 *aabbMin,btVector3 *aabbMax,int startNodeIndex,
          int endNodeIndex)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  bool bVar9;
  uint uVar10;
  btQuantizedBvhNode *pbVar11;
  uint uVar12;
  float *pfVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar34 [16];
  float fVar38;
  float fVar41;
  undefined1 auVar39 [16];
  short sVar42;
  undefined1 auVar40 [16];
  float fVar43;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  float fVar56;
  float fVar57;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  undefined8 local_e8;
  ulong local_e0;
  undefined8 local_d8;
  ulong local_d0;
  float *local_c8;
  btQuantizedBvh *local_c0;
  btVector3 *local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float *local_98;
  float *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  float *pfVar13;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar28 [16];
  undefined1 auVar33 [16];
  short sVar35;
  short sVar36;
  short sVar37;
  
  iVar15 = 0;
  if (startNodeIndex < endNodeIndex) {
    fVar50 = (float)*(undefined8 *)rayTarget->m_floats;
    fVar41 = (float)((ulong)*(undefined8 *)rayTarget->m_floats >> 0x20);
    auVar16._4_4_ = fVar41;
    auVar16._0_4_ = rayTarget->m_floats[2];
    auVar16._8_8_ = 0;
    fVar47 = 0.0;
    fVar48 = 0.0;
    fVar49 = 0.0;
    fVar61 = rayTarget->m_floats[2] - raySource->m_floats[2];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = *(ulong *)(rayTarget->m_floats + 1);
    fVar51 = (float)*(undefined8 *)raySource->m_floats;
    fVar43 = (float)((ulong)*(undefined8 *)raySource->m_floats >> 0x20);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = *(ulong *)(raySource->m_floats + 1);
    auVar44 = minps(auVar39,auVar44);
    fVar38 = fVar50 - fVar51;
    fVar41 = fVar41 - fVar43;
    fVar62 = 1.0 / SQRT(fVar61 * fVar61 + fVar38 * fVar38 + fVar41 * fVar41);
    fVar52 = fVar61 * fVar62;
    auVar26._0_4_ = fVar62 * fVar38;
    auVar26._4_4_ = fVar62 * fVar41;
    auVar26._8_4_ = fVar62 * 0.0;
    auVar26._12_4_ = fVar62 * 0.0;
    fVar38 = fVar61 * fVar52 + fVar41 * auVar26._4_4_ + auVar26._0_4_ * fVar38;
    auVar39 = divps(_DAT_001ee3f0,auVar26);
    fVar56 = (float)(~-(uint)(auVar26._8_4_ == 0.0) & auVar39._8_4_);
    fVar57 = (float)(~-(uint)(auVar26._12_4_ == 0.0) & auVar39._12_4_);
    fVar61 = (float)(-(uint)(auVar26._0_4_ == 0.0) & 0x5d5e0b6b |
                    ~-(uint)(auVar26._0_4_ == 0.0) & auVar39._0_4_);
    fVar62 = (float)(-(uint)(auVar26._4_4_ == 0.0) & 0x5d5e0b6b |
                    ~-(uint)(auVar26._4_4_ == 0.0) & auVar39._4_4_);
    fVar41 = fVar50;
    if (fVar51 <= fVar50) {
      fVar41 = fVar51;
    }
    fVar41 = fVar41 + aabbMin->m_floats[0];
    fVar63 = (float)(-(uint)(fVar52 == 0.0) & 0x5d5e0b6b |
                    ~-(uint)(fVar52 == 0.0) & (uint)(1.0 / fVar52));
    fVar52 = (this->m_bvhAabbMin).m_floats[0];
    fVar58 = fVar52;
    if (fVar52 <= fVar41) {
      fVar58 = fVar41;
    }
    fVar41 = (this->m_bvhAabbMax).m_floats[0];
    fVar8 = fVar41;
    if (fVar58 <= fVar41) {
      fVar8 = fVar58;
    }
    auVar54._0_4_ = (float)*(undefined8 *)(aabbMin->m_floats + 1) + auVar44._0_4_;
    auVar54._4_4_ = (float)((ulong)*(undefined8 *)(aabbMin->m_floats + 1) >> 0x20) + auVar44._4_4_;
    auVar54._8_4_ = auVar44._8_4_ + 0.0;
    auVar54._12_4_ = auVar44._12_4_ + 0.0;
    uVar1 = *(ulong *)((this->m_bvhAabbMin).m_floats + 1);
    fVar58 = (float)uVar1;
    fVar59 = (float)(uVar1 >> 0x20);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar1;
    auVar39 = maxps(auVar60,auVar54);
    uVar1 = *(ulong *)((this->m_bvhAabbMax).m_floats + 1);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar1;
    auVar39 = minps(auVar45,auVar39);
    if (fVar50 <= fVar51) {
      fVar50 = fVar51;
    }
    fVar50 = fVar50 + aabbMax->m_floats[0];
    fVar51 = fVar52;
    if (fVar52 <= fVar50) {
      fVar51 = fVar50;
    }
    if (fVar51 <= fVar41) {
      fVar41 = fVar51;
    }
    fVar41 = fVar41 - fVar52;
    auVar7._4_4_ = fVar43;
    auVar7._0_4_ = raySource->m_floats[2];
    auVar7._8_8_ = 0;
    auVar16 = maxps(auVar16,auVar7);
    auVar24._0_4_ = (float)((ulong)*(undefined8 *)(aabbMax->m_floats + 1) >> 0x20) + auVar16._0_4_;
    auVar24._4_4_ = (float)*(undefined8 *)(aabbMax->m_floats + 1) + auVar16._4_4_;
    auVar24._8_4_ = auVar16._8_4_ + 0.0;
    auVar24._12_4_ = auVar16._12_4_ + 0.0;
    auVar17._4_4_ = fVar58;
    auVar17._0_4_ = fVar59;
    auVar17._8_8_ = 0;
    auVar16 = maxps(auVar17,auVar24);
    uVar2 = *(undefined8 *)((this->m_bvhQuantization).m_floats + 1);
    fVar51 = (float)uVar2;
    auVar46._0_4_ = (auVar39._0_4_ - fVar58) * fVar51;
    fVar43 = (float)((ulong)uVar2 >> 0x20);
    auVar46._4_4_ = (auVar39._4_4_ - fVar59) * fVar43;
    auVar46._8_4_ = (auVar39._8_4_ - 0.0) * 0.0;
    auVar46._12_4_ = (auVar39._12_4_ - 0.0) * 0.0;
    auVar55._4_4_ = (int)uVar1;
    auVar55._0_4_ = (int)(uVar1 >> 0x20);
    auVar55._8_8_ = 0;
    auVar16 = minps(auVar55,auVar16);
    fVar50 = (this->m_bvhQuantization).m_floats[0];
    fVar52 = fVar50 * (fVar8 - fVar52);
    fVar50 = fVar50 * fVar41 + 1.0;
    fVar51 = fVar51 * (auVar16._4_4_ - fVar58) + 1.0;
    auVar53._4_4_ = (fVar41 - fVar41) * 1.0;
    auVar53._0_4_ = fVar52;
    auVar53._8_4_ = fVar51;
    auVar53._12_4_ = fVar50;
    auVar18._0_4_ = (int)fVar50;
    auVar18._4_4_ = (int)(fVar43 * (auVar16._0_4_ - fVar59) + 1.0);
    auVar18._8_4_ = (int)fVar51;
    auVar18._12_4_ = (int)fVar52;
    auVar16 = pshuflw(auVar18,auVar18,0xe8);
    auVar16 = pshufhw(auVar16,auVar16,0xe8);
    auVar19._0_4_ = auVar16._0_4_;
    auVar19._8_4_ = auVar16._8_4_;
    auVar19._12_4_ = auVar16._12_4_;
    auVar19._4_4_ = auVar19._8_4_;
    auVar25 = (_DAT_001eedc0 | auVar19) & _DAT_001ee9f0;
    auVar20._0_4_ = (int)auVar46._0_4_;
    auVar20._4_4_ = (int)auVar46._4_4_;
    auVar20._8_4_ = (int)auVar46._8_4_;
    auVar20._12_4_ = (int)auVar46._12_4_;
    auVar16 = pshuflw(auVar53,auVar20,0xe8);
    pbVar11 = (this->m_quantizedContiguousNodes).m_data + startNodeIndex;
    pfVar14 = (float *)(&local_e8 + (ulong)(fVar61 < 0.0) * 2);
    local_98 = (float *)(&local_e8 + (ulong)(0.0 <= fVar61) * 2);
    pfVar13 = (float *)((long)&local_e8 + (ulong)(fVar62 < 0.0) * 0x10 + 4);
    local_a0 = pfVar13;
    local_90 = (float *)((long)&local_e8 + (ulong)(0.0 <= fVar62) * 0x10 + 4);
    local_b0 = (float *)(&local_e0 + (ulong)(fVar63 < 0.0) * 2);
    local_a8 = (float *)(&local_e0 + (ulong)(0.0 <= fVar63) * 2);
    iVar15 = 0;
    auVar39 = auVar16 & _DAT_001eeda0 ^ _DAT_001eede0;
    auVar16 = (~_DAT_001ee9f0 & auVar19 & _DAT_001eedd0 | auVar25) ^ _DAT_001eede0;
    local_b8 = aabbMin;
    local_c0 = this;
    _local_48 = ZEXT416((uint)fVar38);
    local_58 = fVar61;
    fStack_54 = fVar62;
    fStack_50 = fVar56;
    fStack_4c = fVar57;
    local_68 = fVar63;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_78 = auVar16;
    local_88 = auVar39;
    local_c8 = pfVar14;
    auVar44 = _DAT_001eede0;
    do {
      uVar10 = *(uint *)pbVar11->m_quantizedAabbMin;
      auVar26 = pshuflw(auVar25,ZEXT416(uVar10),0xd4);
      auVar27._8_8_ = auVar26._8_8_;
      auVar27._0_8_ =
           auVar26._0_8_ & 0xffff0000ffff | (ulong)pbVar11->m_quantizedAabbMin[2] << 0x10 |
           (ulong)pbVar11->m_quantizedAabbMax[0] << 0x30;
      auVar27 = auVar27 ^ auVar44;
      sVar42 = -(ushort)(auVar27._6_2_ < auVar16._6_2_);
      auVar25._0_2_ = -(ushort)(auVar16._0_2_ < auVar27._0_2_);
      sVar35 = -(ushort)(auVar16._2_2_ < auVar27._2_2_);
      auVar29._0_4_ = CONCAT22(sVar35,auVar25._0_2_);
      sVar36 = -(ushort)(auVar16._4_2_ < auVar27._4_2_);
      auVar30._0_6_ = CONCAT24(sVar36,auVar29._0_4_);
      sVar37 = -(ushort)(auVar16._6_2_ < auVar27._6_2_);
      auVar31._0_8_ = CONCAT26(sVar37,auVar30._0_6_);
      auVar23._0_10_ = CONCAT28(-(ushort)(auVar16._8_2_ < auVar27._8_2_),auVar31._0_8_);
      auVar23._10_2_ = -(ushort)(auVar16._10_2_ < auVar27._10_2_);
      auVar28._12_2_ = -(ushort)(auVar16._12_2_ < auVar27._12_2_);
      auVar28._0_12_ = auVar23;
      auVar28._14_2_ = -(ushort)(auVar16._14_2_ < auVar27._14_2_);
      auVar26 = pshuflw(auVar46,auVar28,0x50);
      auVar33._12_2_ = sVar37;
      auVar33._0_12_ = auVar23;
      auVar33._14_2_ = sVar37;
      auVar32._12_4_ = auVar33._12_4_;
      auVar32._10_2_ = sVar36;
      auVar32._0_10_ = auVar23._0_10_;
      auVar31._10_6_ = auVar32._10_6_;
      auVar31._8_2_ = sVar36;
      auVar30._8_8_ = auVar31._8_8_;
      auVar30._6_2_ = sVar35;
      auVar29._6_10_ = auVar30._6_10_;
      auVar29._4_2_ = sVar35;
      auVar25._4_12_ = auVar29._4_12_;
      auVar25._2_2_ = auVar25._0_2_;
      auVar46._14_2_ = sVar42;
      auVar46._12_2_ = sVar42;
      auVar46._0_8_ = auVar26._0_8_;
      auVar46._8_4_ = (float)auVar31._8_4_;
      uVar12 = movmskps((int)pfVar13,auVar46);
      pfVar13 = (float *)(ulong)uVar12;
      bVar9 = false;
      if (uVar12 == 0) {
        auVar26 = ZEXT416(*(uint *)(pbVar11->m_quantizedAabbMax + 1)) ^ auVar44;
        auVar40._0_2_ = -(ushort)(auVar26._0_2_ < auVar39._0_2_);
        auVar40._2_2_ = -(ushort)(auVar26._2_2_ < auVar39._2_2_);
        auVar40._4_2_ = -(ushort)(auVar26._4_2_ < auVar39._4_2_);
        auVar40._6_2_ = -(ushort)(auVar26._6_2_ < auVar39._6_2_);
        auVar40._8_2_ = -(ushort)(auVar26._8_2_ < auVar39._8_2_);
        auVar40._10_2_ = -(ushort)(auVar26._10_2_ < auVar39._10_2_);
        auVar40._12_2_ = -(ushort)(auVar26._12_2_ < auVar39._12_2_);
        auVar40._14_2_ = -(ushort)(auVar26._14_2_ < auVar39._14_2_);
        auVar26 = pshuflw(auVar26,auVar40,0x50);
        auVar25._0_4_ = auVar26._0_4_;
        auVar25._4_4_ = auVar25._0_4_;
        auVar25._8_4_ = auVar26._4_4_;
        auVar25._12_4_ = auVar26._4_4_;
        uVar12 = movmskpd(0,auVar25);
        pfVar13 = (float *)(ulong)uVar12;
        if (((byte)((byte)uVar12 >> 1) != 0) || ((uVar12 & 1) != 0)) goto LAB_0013a54a;
        fVar41 = (this->m_bvhAabbMin).m_floats[2];
        fVar50 = (this->m_bvhQuantization).m_floats[2];
        auVar21._0_4_ = (float)(uVar10 & 0xffff);
        auVar21._4_4_ = (float)(uVar10 >> 0x10);
        auVar21._8_8_ = 0;
        fVar51 = (float)pbVar11->m_quantizedAabbMax[2] / fVar50 + fVar41;
        auVar46 = ZEXT416((uint)fVar51);
        uVar2 = *(undefined8 *)(this->m_bvhAabbMin).m_floats;
        uVar1 = *(ulong *)(this->m_bvhQuantization).m_floats;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar1;
        auVar26 = divps(auVar21,auVar4);
        fVar43 = (float)uVar2;
        fVar52 = (float)((ulong)uVar2 >> 0x20);
        local_e8 = CONCAT44((auVar26._4_4_ + fVar52) -
                            (float)((ulong)*(undefined8 *)aabbMax->m_floats >> 0x20),
                            (auVar26._0_4_ + fVar43) - (float)*(undefined8 *)aabbMax->m_floats);
        local_e0 = (ulong)(uint)(((float)pbVar11->m_quantizedAabbMin[2] / fVar50 + fVar41) -
                                aabbMax->m_floats[2]);
        auVar22._0_4_ = (float)(*(uint *)pbVar11->m_quantizedAabbMax & 0xffff);
        auVar22._4_4_ = (float)(*(uint *)pbVar11->m_quantizedAabbMax >> 0x10);
        auVar22._8_8_ = 0;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar1;
        auVar26 = divps(auVar22,auVar5);
        local_d8 = CONCAT44((auVar26._4_4_ + fVar52) -
                            (float)((ulong)*(undefined8 *)aabbMin->m_floats >> 0x20),
                            (auVar26._0_4_ + fVar43) - (float)*(undefined8 *)aabbMin->m_floats);
        local_d0 = (ulong)(uint)(fVar51 - aabbMin->m_floats[2]);
        uVar1 = *(ulong *)raySource->m_floats;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar1;
        fVar50 = (float)(uVar1 >> 0x20);
        fVar51 = (*pfVar14 - (float)uVar1) * fVar61;
        fVar41 = (*local_90 - fVar50) * fVar62;
        auVar34._4_4_ = fVar41;
        auVar34._0_4_ = fVar51;
        if (fVar41 < fVar51) {
LAB_0013a548:
          bVar9 = false;
          goto LAB_0013a54a;
        }
        auVar46._0_4_ = (*local_98 - (float)uVar1) * fVar61;
        auVar46._4_4_ = (*local_a0 - fVar50) * fVar62;
        auVar46._8_4_ = fVar56 * 0.0;
        auVar46._12_4_ = fVar57 * 0.0;
        auVar25._4_4_ = auVar46._4_4_;
        auVar25._0_4_ = auVar46._4_4_;
        auVar25._8_4_ = auVar46._4_4_;
        auVar25._12_4_ = auVar46._4_4_;
        if (auVar46._0_4_ < auVar46._4_4_) goto LAB_0013a548;
        auVar6._4_4_ = -(uint)(fVar51 < auVar46._4_4_);
        auVar6._0_4_ = -(uint)(fVar51 < auVar46._4_4_);
        auVar6._8_4_ = -(uint)(fVar41 < auVar46._0_4_);
        auVar6._12_4_ = -(uint)(fVar41 < auVar46._0_4_);
        uVar10 = movmskpd((int)local_98,auVar6);
        if ((uVar10 & 1) == 0) {
          auVar34._8_4_ = fVar56 * 0.0;
          auVar34._12_4_ = fVar57 * 0.0;
          auVar25 = auVar34;
        }
        if ((uVar10 & 2) == 0) {
          fVar41 = auVar46._0_4_;
        }
        fVar50 = (*local_a8 - raySource->m_floats[2]) * fVar63;
        fVar51 = auVar25._0_4_;
        if (fVar50 < fVar51) goto LAB_0013a548;
        fVar43 = (*local_b0 - raySource->m_floats[2]) * fVar63;
        auVar46 = ZEXT416((uint)fVar43);
        if (fVar41 < fVar43) goto LAB_0013a548;
        if (fVar43 <= fVar51) {
          auVar46 = ZEXT416((uint)fVar51);
        }
        fVar51 = auVar46._8_4_;
        fVar43 = auVar46._12_4_;
        bVar3 = auVar46._0_4_ < fVar38;
        auVar46._4_4_ = (float)-(uint)(0.0 < fVar47);
        auVar46._0_4_ = (float)-(uint)bVar3;
        auVar46._8_4_ = (float)-(uint)(fVar51 < fVar48);
        auVar46._12_4_ = (float)-(uint)(fVar43 < fVar49);
        if (fVar41 <= fVar50) {
          fVar50 = fVar41;
        }
        bVar9 = 0.0 < fVar50 && bVar3;
        if ((pbVar11->m_escapeIndexOrTriangleIndex < 0) || (0.0 >= fVar50 || !bVar3))
        goto LAB_0013a54a;
        pfVar13 = (float *)(ulong)(uint)(pbVar11->m_escapeIndexOrTriangleIndex >> 0x15);
        (*nodeCallback->_vptr_btNodeOverlapCallback[2])
                  (nodeCallback,pfVar13,(ulong)(pbVar11->m_escapeIndexOrTriangleIndex & 0x1fffff));
        aabbMin = local_b8;
        pfVar14 = local_c8;
        this = local_c0;
        auVar16 = local_78;
        auVar39 = local_88;
        auVar44 = _DAT_001eede0;
        fVar38 = (float)local_48._0_4_;
        fVar47 = (float)local_48._4_4_;
        fVar48 = fStack_40;
        fVar49 = fStack_3c;
        fVar61 = local_58;
        fVar62 = fStack_54;
        fVar56 = fStack_50;
        fVar57 = fStack_4c;
        fVar63 = local_68;
LAB_0013a563:
        pbVar11 = pbVar11 + 1;
        startNodeIndex = startNodeIndex + 1;
      }
      else {
LAB_0013a54a:
        if ((-1 < pbVar11->m_escapeIndexOrTriangleIndex) || (bVar9)) goto LAB_0013a563;
        startNodeIndex = startNodeIndex - pbVar11->m_escapeIndexOrTriangleIndex;
        pbVar11 = pbVar11 + -(long)pbVar11->m_escapeIndexOrTriangleIndex;
      }
      iVar15 = iVar15 + 1;
    } while (startNodeIndex < endNodeIndex);
  }
  if (maxIterations < iVar15) {
    maxIterations = iVar15;
  }
  return;
}

Assistant:

void	btQuantizedBvh::walkStacklessQuantizedTreeAgainstRay(btNodeOverlapCallback* nodeCallback, const btVector3& raySource, const btVector3& rayTarget, const btVector3& aabbMin, const btVector3& aabbMax, int startNodeIndex,int endNodeIndex) const
{
	btAssert(m_useQuantization);
	
	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const btQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned boxBoxOverlap = 0;
	unsigned rayBoxOverlap = 0;

	btScalar lambda_max = 1.0;

#ifdef RAYAABB2
	btVector3 rayDirection = (rayTarget-raySource);
	rayDirection.normalize ();
	lambda_max = rayDirection.dot(rayTarget-raySource);
	///what about division by zero? --> just set rayDirection[i] to 1.0
	rayDirection[0] = rayDirection[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[0];
	rayDirection[1] = rayDirection[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[1];
	rayDirection[2] = rayDirection[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[2];
	unsigned int sign[3] = { rayDirection[0] < 0.0, rayDirection[1] < 0.0, rayDirection[2] < 0.0};
#endif

	/* Quick pruning by quantized box */
	btVector3 rayAabbMin = raySource;
	btVector3 rayAabbMax = raySource;
	rayAabbMin.setMin(rayTarget);
	rayAabbMax.setMax(rayTarget);

	/* Add box cast extents to bounding box */
	rayAabbMin += aabbMin;
	rayAabbMax += aabbMax;

	unsigned short int quantizedQueryAabbMin[3];
	unsigned short int quantizedQueryAabbMax[3];
	quantizeWithClamp(quantizedQueryAabbMin,rayAabbMin,0);
	quantizeWithClamp(quantizedQueryAabbMax,rayAabbMax,1);

	while (curIndex < endNodeIndex)
	{

//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern btIDebugDraw* debugDrawerPtr;
		if (curIndex==drawPatch)
		{
			btVector3 aabbMin,aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			btVector3	color(1,0,0);
			debugDrawerPtr->drawAabb(aabbMin,aabbMax,color);
		}
#endif//VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		btAssert (walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		// only interested if this is closer than any previous hit
		btScalar param = 1.0;
		rayBoxOverlap = 0;
		boxBoxOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,rootNode->m_quantizedAabbMin,rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();
		if (boxBoxOverlap)
		{
			btVector3 bounds[2];
			bounds[0] = unQuantize(rootNode->m_quantizedAabbMin);
			bounds[1] = unQuantize(rootNode->m_quantizedAabbMax);
			/* Add box cast extents */
			bounds[0] -= aabbMax;
			bounds[1] -= aabbMin;
			btVector3 normal;
#if 0
			bool ra2 = btRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0, lambda_max);
			bool ra = btRayAabb (raySource, rayTarget, bounds[0], bounds[1], param, normal);
			if (ra2 != ra)
			{
				printf("functions don't match\n");
			}
#endif
#ifdef RAYAABB2
			///careful with this check: need to check division by zero (above) and fix the unQuantize method
			///thanks Joerg/hiker for the reproduction case!
			///http://www.bulletphysics.com/Bullet/phpBB3/viewtopic.php?f=9&t=1858

			//BT_PROFILE("btRayAabb2");
			rayBoxOverlap = btRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0f, lambda_max);
			
#else
			rayBoxOverlap = true;//btRayAabb(raySource, rayTarget, bounds[0], bounds[1], param, normal);
#endif
		}
		
		if (isLeafNode && rayBoxOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(),rootNode->getTriangleIndex());
		}
		
		//PCK: unsigned instead of bool
		if ((rayBoxOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		} else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;

}